

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cpp
# Opt level: O1

uint16_t __thiscall
duckdb::roaring::ContainerSegmentScan::operator++(ContainerSegmentScan *this,int param_1)

{
  ulong uVar1;
  byte bVar2;
  
  uVar1 = (ulong)this->index;
  if (uVar1 < 8) {
    bVar2 = this->count;
    do {
      if (bVar2 < this->segments[uVar1]) goto LAB_01718795;
      this->count = '\0';
      uVar1 = uVar1 + 1;
      this->index = (uint8_t)uVar1;
      bVar2 = 0;
    } while ((uint8_t)uVar1 != '\b');
    uVar1 = 8;
  }
LAB_01718795:
  this->count = this->count + '\x01';
  return (uint16_t)(((uint)uVar1 & 0xff) << 8);
}

Assistant:

uint16_t ContainerSegmentScan::operator++(int) {
	while (index < COMPRESSED_SEGMENT_COUNT && count >= segments[index]) {
		count = 0;
		index++;
	}
	count++;

	// index == COMPRESSED_SEGMENT_COUNT is allowed for runs, as the last run could end at ROARING_CONTAINER_SIZE
	D_ASSERT(index <= COMPRESSED_SEGMENT_COUNT);
	if (index < COMPRESSED_SEGMENT_COUNT) {
		D_ASSERT(segments[index] != 0);
	}
	uint16_t base = static_cast<uint16_t>(index) * COMPRESSED_SEGMENT_SIZE;
	return base;
}